

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void estimate_noise(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats,
                   aom_internal_error_info *error_info)

{
  FIRSTPASS_STATS *pFVar1;
  FIRSTPASS_STATS *pFVar2;
  ulong uVar3;
  double *pdVar4;
  void *memblk;
  long lVar5;
  FIRSTPASS_STATS *pFVar6;
  int iVar7;
  FIRSTPASS_STATS *pFVar8;
  int iVar9;
  long lVar10;
  double *pdVar11;
  uint uVar12;
  double dVar13;
  double total_noise;
  double total_wt;
  double dVar14;
  double dVar15;
  
  pFVar1 = first_stats + 2;
  pFVar6 = pFVar1;
  if (pFVar1 < last_stats) {
    do {
      pFVar6->noise_var = 0.0;
      if (((pFVar6->is_flash == 0) && (pFVar6[-1].is_flash == 0)) && (pFVar6[-2].is_flash == 0)) {
        dVar13 = (pFVar6->intra_error - pFVar6->coded_error) * pFVar6[-1].intra_error;
        if (0.0 < dVar13) {
          dVar15 = (pFVar6[-1].intra_error - pFVar6[-1].coded_error) * pFVar6[-2].intra_error;
          if ((0.0 < dVar15) &&
             (dVar14 = pFVar6[-2].intra_error * (pFVar6->intra_error - pFVar6->sr_coded_error),
             0.0 < dVar14)) {
            if (dVar13 < 0.0) {
              dVar13 = sqrt(dVar13);
            }
            else {
              dVar13 = SQRT(dVar13);
            }
            if (dVar15 < 0.0) {
              dVar15 = sqrt(dVar15);
            }
            else {
              dVar15 = SQRT(dVar15);
            }
            if (dVar14 < 0.0) {
              dVar14 = sqrt(dVar14);
            }
            else {
              dVar14 = SQRT(dVar14);
            }
            dVar13 = pFVar6[-1].intra_error - (dVar13 * dVar15) / dVar14;
            if (dVar13 <= 0.01) {
              dVar13 = 0.01;
            }
            pFVar6->noise_var = dVar13;
          }
        }
      }
      pFVar6 = pFVar6 + 1;
    } while (pFVar6 < last_stats);
    if (pFVar1 < last_stats) {
      uVar3 = 0x1d0;
      lVar5 = 0x2b8;
      pFVar6 = pFVar1;
LAB_001f48c5:
      if (((pFVar6->is_flash == 0) && (pFVar6[-1].is_flash == 0)) &&
         ((pFVar6[-2].is_flash == 0 &&
          (pFVar8 = pFVar6, pFVar6->noise_var <= 1.0 && pFVar6->noise_var != 1.0)))) {
        do {
          pFVar2 = pFVar8;
          pFVar8 = pFVar2 + 1;
          if (last_stats <= pFVar8) {
            lVar10 = lVar5;
            if (uVar3 < 0x2b8) goto LAB_001f4983;
            goto LAB_001f4943;
          }
        } while ((((pFVar2[1].is_flash != 0) || (pFVar2->is_flash != 0)) ||
                 (pFVar2[-1].is_flash != 0)) || (dVar13 = pFVar2[1].noise_var, dVar13 < 1.0));
LAB_001f499f:
        pFVar6->noise_var = dVar13;
      }
      goto LAB_001f4983;
    }
  }
LAB_001f4ab7:
  uVar12 = (int)((long)last_stats - (long)first_stats >> 3) * 0x4f72c235;
  memblk = aom_malloc((long)(int)uVar12 << 3);
  if (memblk != (void *)0x0) {
    if (0 < (int)uVar12) {
      uVar3 = 0;
      do {
        dVar15 = 0.0;
        iVar7 = -3;
        dVar13 = 0.0;
        do {
          iVar9 = (int)uVar3 + iVar7;
          if (iVar9 < 1) {
            iVar9 = 0;
          }
          if ((int)(uVar12 - 1) <= iVar9) {
            iVar9 = uVar12 - 1;
          }
          if (first_stats[iVar9].is_flash == 0) {
            dVar13 = dVar13 + first_stats[iVar9].noise_var;
            dVar15 = dVar15 + 1.0;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != 4);
        if (dVar15 <= 0.01) {
          dVar13 = first_stats[uVar3].noise_var;
        }
        else {
          dVar13 = dVar13 / dVar15;
        }
        *(double *)((long)memblk + uVar3 * 8) = dVar13;
        uVar3 = uVar3 + 1;
      } while (uVar3 != (uVar12 & 0x7fffffff));
      pdVar4 = &first_stats->noise_var;
      uVar3 = 0;
      do {
        *pdVar4 = *(double *)((long)memblk + uVar3 * 8);
        uVar3 = uVar3 + 1;
        pdVar4 = pdVar4 + 0x1d;
      } while ((uVar12 & 0x7fffffff) != uVar3);
    }
    aom_free(memblk);
    return;
  }
  aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,
                     "Error allocating buffers in smooth_filter_noise()");
  return;
  while (lVar10 = lVar10 + -0xe8, 0x39f < lVar10) {
LAB_001f4943:
    if (((*(long *)((long)first_stats + lVar10 + -0x110) == 0) &&
        (*(long *)((long)first_stats + lVar10 + -0x1f8) == 0)) &&
       ((*(long *)((long)first_stats + lVar10 + -0x2e0) == 0 &&
        (dVar13 = *(double *)((long)first_stats + lVar10 + -0x108), 1.0 <= dVar13))))
    goto LAB_001f499f;
  }
LAB_001f4983:
  pFVar6 = (FIRSTPASS_STATS *)((long)&first_stats[1].frame + uVar3);
  uVar3 = uVar3 + 0xe8;
  lVar5 = lVar5 + 0xe8;
  if (last_stats <= pFVar6) goto LAB_001f49a9;
  goto LAB_001f48c5;
LAB_001f49a9:
  if (pFVar1 < last_stats) {
    pdVar4 = &first_stats[3].noise_var;
    uVar3 = 0x1d0;
    lVar5 = 0x2b8;
    pFVar6 = pFVar1;
    do {
      if (((pFVar6->is_flash != 0) || (pFVar6[-1].is_flash != 0)) || (pFVar6[-2].is_flash != 0)) {
        pFVar8 = pFVar6 + 1;
        pdVar11 = pdVar4;
        while (pFVar8 < last_stats) {
          if (((pdVar11[-1] == 0.0) && (pdVar11[-0x1e] == 0.0)) && (pdVar11[-0x3b] == 0.0))
          goto LAB_001f4a70;
          pFVar8 = (FIRSTPASS_STATS *)(pdVar11 + 4);
          pdVar11 = pdVar11 + 0x1d;
        }
        lVar10 = lVar5;
        if (0x2b7 < uVar3) {
LAB_001f4a33:
          if (((*(long *)((long)first_stats + lVar10 + -0x110) != 0) ||
              (*(long *)((long)first_stats + lVar10 + -0x1f8) != 0)) ||
             (*(long *)((long)first_stats + lVar10 + -0x2e0) != 0)) goto LAB_001f4a54;
          pdVar11 = (double *)((long)first_stats + lVar10 + -0x108);
LAB_001f4a70:
          pFVar6->noise_var = *pdVar11;
        }
      }
LAB_001f4a7d:
      pFVar6 = (FIRSTPASS_STATS *)((long)&first_stats[1].frame + uVar3);
      uVar3 = uVar3 + 0xe8;
      pdVar4 = pdVar4 + 0x1d;
      lVar5 = lVar5 + 0xe8;
    } while (pFVar6 < last_stats);
    if (pFVar1 < last_stats) {
      first_stats->noise_var = first_stats[2].noise_var;
      first_stats[1].noise_var = first_stats[2].noise_var;
    }
  }
  goto LAB_001f4ab7;
LAB_001f4a54:
  lVar10 = lVar10 + -0xe8;
  if (lVar10 < 0x3a0) goto LAB_001f4a7d;
  goto LAB_001f4a33;
}

Assistant:

static void estimate_noise(FIRSTPASS_STATS *first_stats,
                           FIRSTPASS_STATS *last_stats,
                           struct aom_internal_error_info *error_info) {
  FIRSTPASS_STATS *this_stats, *next_stats;
  double C1, C2, C3, noise;
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    this_stats->noise_var = 0.0;
    // flashes tend to have high correlation of innovations, so ignore them.
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash)
      continue;

    C1 = (this_stats - 1)->intra_error *
         (this_stats->intra_error - this_stats->coded_error);
    C2 = (this_stats - 2)->intra_error *
         ((this_stats - 1)->intra_error - (this_stats - 1)->coded_error);
    C3 = (this_stats - 2)->intra_error *
         (this_stats->intra_error - this_stats->sr_coded_error);
    if (C1 <= 0 || C2 <= 0 || C3 <= 0) continue;
    C1 = sqrt(C1);
    C2 = sqrt(C2);
    C3 = sqrt(C3);

    noise = (this_stats - 1)->intra_error - C1 * C2 / C3;
    noise = AOMMAX(noise, 0.01);
    this_stats->noise_var = noise;
  }

  // Copy noise from the neighbor if the noise value is not trustworthy
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash)
      continue;
    if (this_stats->noise_var < 1.0) {
      int found = 0;
      // TODO(bohanli): consider expanding to two directions at the same time
      for (next_stats = this_stats + 1; next_stats < last_stats; next_stats++) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash || next_stats->noise_var < 1.0)
          continue;
        found = 1;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
      if (found) continue;
      for (next_stats = this_stats - 1; next_stats >= first_stats + 2;
           next_stats--) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash || next_stats->noise_var < 1.0)
          continue;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
    }
  }

  // copy the noise if this is a flash
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash) {
      int found = 0;
      for (next_stats = this_stats + 1; next_stats < last_stats; next_stats++) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash)
          continue;
        found = 1;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
      if (found) continue;
      for (next_stats = this_stats - 1; next_stats >= first_stats + 2;
           next_stats--) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash)
          continue;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
    }
  }

  // if we are at the first 2 frames, copy the noise
  for (this_stats = first_stats;
       this_stats < first_stats + 2 && (first_stats + 2) < last_stats;
       this_stats++) {
    this_stats->noise_var = (first_stats + 2)->noise_var;
  }

  if (smooth_filter_noise(first_stats, last_stats) == -1) {
    aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating buffers in smooth_filter_noise()");
  }
}